

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

branch * dungeon_branch(char *s)

{
  xchar xVar1;
  branch **ppbVar2;
  
  xVar1 = dname_to_dnum(s,'\0');
  ppbVar2 = &branches;
  do {
    ppbVar2 = &((branch *)ppbVar2)->next->next;
    if ((branch *)ppbVar2 == (branch *)0x0) {
      panic("dgn_entrance: can\'t find entrance to %s",s);
    }
  } while ((((branch *)ppbVar2)->end2).dnum != xVar1);
  return (branch *)ppbVar2;
}

Assistant:

branch *dungeon_branch(const char *s)
{
    branch *br;
    xchar  dnum;

    dnum = dname_to_dnum(s, FALSE);

    /* Find the branch that connects to dungeon i's branch. */
    for (br = branches; br; br = br->next)
	if (br->end2.dnum == dnum) break;

    if (!br) panic("dgn_entrance: can't find entrance to %s", s);

    return br;
}